

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_recursive_mutex.hpp
# Opt level: O0

void __thiscall
wigwag::threading::shared_recursive_mutex::lock_primitive::lock_recursive(lock_primitive *this)

{
  element_type *this_00;
  lock_primitive *this_local;
  
  this_00 = std::__shared_ptr_access<std::recursive_mutex,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<std::recursive_mutex,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
  std::recursive_mutex::lock(this_00);
  return;
}

Assistant:

void lock_recursive() const { _mutex->lock(); }